

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void flatbuffers::AppendShortOption(stringstream *ss,FlatCOption *option)

{
  ulong uVar1;
  ostream *poVar2;
  FlatCOption *option_local;
  stringstream *ss_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)(ss + 0x10),"-");
    std::operator<<(poVar2,(string *)option);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator<<((ostream *)(ss + 0x10),"|");
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)(ss + 0x10),"--");
    std::operator<<(poVar2,(string *)&option->long_opt);
  }
  return;
}

Assistant:

static void AppendShortOption(std::stringstream &ss,
                              const FlatCOption &option) {
  if (!option.short_opt.empty()) {
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) { ss << "|"; }
  }
  if (!option.long_opt.empty()) { ss << "--" << option.long_opt; }
}